

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  int32_t hiddenSize;
  int32_t outputSize;
  int iVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  Predictions predictions;
  State state;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_b8;
  real local_9c;
  Predictions local_98;
  Meter *local_80;
  State local_78;
  
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hiddenSize = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->dim;
  local_9c = threshold;
  local_80 = meter;
  outputSize = Dictionary::nlabels((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
  Model::State::State(&local_78,hiddenSize,outputSize,0);
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg((long)in,_S_beg);
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,&local_b8,&local_d8);
    if ((local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) &&
       (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      if (local_98.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_98.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_98.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_98.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      predict(this,k,&local_b8,&local_98,local_9c);
      Meter::log(local_80,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
  }
  free(local_78.grad.data_.mem_);
  free(local_78.output.data_.mem_);
  free(local_78.hidden.data_.mem_);
  if (local_98.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
    const {
  std::vector<int32_t> line;
  std::vector<int32_t> labels;
  Predictions predictions;
  Model::State state(args_->dim, dict_->nlabels(), 0);
  in.clear();
  in.seekg(0, std::ios_base::beg);

  while (in.peek() != EOF) {
    line.clear();
    labels.clear();
    dict_->getLine(in, line, labels);

    if (!labels.empty() && !line.empty()) {
      predictions.clear();
      predict(k, line, predictions, threshold);
      meter.log(labels, predictions);
    }
  }
}